

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhRestorePage(lhash_kv_engine *pEngine,unqlite_page *pPage)

{
  sxu64 n64;
  int iVar1;
  
  iVar1 = (*pEngine->pIo->xWrite)(pEngine->pHeader);
  if (iVar1 == 0) {
    iVar1 = (*pEngine->pIo->xWrite)(pPage);
    if (iVar1 == 0) {
      SyBigEndianPack64(pPage->zData,pEngine->nFreeList);
      n64 = pPage->iPage;
      pEngine->nFreeList = n64;
      SyBigEndianPack64(pEngine->pHeader->zData + 8,n64);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int lhRestorePage(lhash_kv_engine *pEngine,unqlite_page *pPage)
{
	int rc;
	rc = pEngine->pIo->xWrite(pEngine->pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	rc = pEngine->pIo->xWrite(pPage);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Link to the list of free page */
	SyBigEndianPack64(pPage->zData,pEngine->nFreeList);
	pEngine->nFreeList = pPage->iPage;
	SyBigEndianPack64(&pEngine->pHeader->zData[4/*Magic*/+4/*Hash*/],pEngine->nFreeList);
	/* All done */
	return UNQLITE_OK;
}